

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O0

void __thiscall
r_exec::_Fact::_Fact
          (_Fact *this,uint16_t opcode,Code *object,uint64_t after,uint64_t before,double confidence
          ,double psln_thr)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Atom local_68 [4];
  Atom local_64 [4];
  Atom local_60 [4];
  Atom local_5c [4];
  Atom local_58 [20];
  Atom local_44 [4];
  double local_40;
  double psln_thr_local;
  double confidence_local;
  uint64_t before_local;
  uint64_t after_local;
  Code *object_local;
  _Fact *p_Stack_10;
  uint16_t opcode_local;
  _Fact *this_local;
  
  local_40 = psln_thr;
  psln_thr_local = confidence;
  confidence_local = (double)before;
  before_local = after;
  after_local = (uint64_t)object;
  object_local._6_2_ = opcode;
  p_Stack_10 = this;
  LObject::LObject(&this->super_LObject,(Mem *)0x0);
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR___Fact_002eacc8;
  r_code::Atom::Object((ushort)local_44,(uchar)object_local._6_2_);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,0);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_44);
  r_code::Atom::~Atom(local_44);
  r_code::Atom::RPointer((ushort)local_58);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar1),local_58);
  r_code::Atom::~Atom(local_58);
  r_code::Atom::IPointer((ushort)local_5c);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,2);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_5c);
  r_code::Atom::~Atom(local_5c);
  r_code::Atom::IPointer((ushort)local_60);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar1),local_60);
  r_code::Atom::~Atom(local_60);
  r_code::Atom::Float((float)psln_thr_local);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar1),local_64);
  r_code::Atom::~Atom(local_64);
  r_code::Atom::Float((float)local_40);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,5);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar1),local_68);
  r_code::Atom::~Atom(local_68);
  r_code::Utils::SetIndirectTimestamp<r_code::Code>((Code *)this,2,before_local);
  r_code::Utils::SetIndirectTimestamp<r_code::Code>((Code *)this,3,(uint64_t)confidence_local);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[0x19])(this,after_local);
  return;
}

Assistant:

_Fact::_Fact(uint16_t opcode, Code *object, uint64_t after, uint64_t before, double confidence, double psln_thr): LObject()
{
    code(0) = Atom::Object(opcode, FACT_ARITY);
    code(FACT_OBJ) = Atom::RPointer(0);
    code(FACT_AFTER) = Atom::IPointer(FACT_ARITY + 1);
    code(FACT_BEFORE) = Atom::IPointer(FACT_ARITY + 4);
    code(FACT_CFD) = Atom::Float(confidence);
    code(FACT_ARITY) = Atom::Float(psln_thr);
    Utils::SetIndirectTimestamp<Code>(this, FACT_AFTER, after);
    Utils::SetIndirectTimestamp<Code>(this, FACT_BEFORE, before);
    add_reference(object);
}